

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O2

void __thiscall
bezier::BinomialCoefficients<10UL>::BinomialCoefficients(BinomialCoefficients<10UL> *this)

{
  size_t sVar1;
  unsigned_long *puVar2;
  long lVar3;
  size_t k;
  
  (this->mCoefficients)._M_elems[8] = 0;
  (this->mCoefficients)._M_elems[9] = 0;
  (this->mCoefficients)._M_elems[6] = 0;
  (this->mCoefficients)._M_elems[7] = 0;
  (this->mCoefficients)._M_elems[4] = 0;
  (this->mCoefficients)._M_elems[5] = 0;
  (this->mCoefficients)._M_elems[10] = 0;
  (this->mCoefficients)._M_elems[2] = 0;
  (this->mCoefficients)._M_elems[3] = 0;
  (this->mCoefficients)._M_elems[0] = 0;
  (this->mCoefficients)._M_elems[1] = 0;
  for (k = 0; k != 6; k = k + 1) {
    sVar1 = internal::binomial(10,k);
    (this->mCoefficients)._M_elems[k] = sVar1;
  }
  puVar2 = (this->mCoefficients)._M_elems + 6;
  for (lVar3 = 4; lVar3 != -1; lVar3 = lVar3 + -1) {
    *puVar2 = (this->mCoefficients)._M_elems[lVar3];
    puVar2 = puVar2 + 1;
  }
  return;
}

Assistant:

BinomialCoefficients()
        {
            size_t center = N / 2;
            size_t k = 0;

            while (k <= center)
            {
                mCoefficients[k] = internal::binomial(N, k);
                k++;
            }

            // Utilize the symmetrical nature of the binomial coefficients.
            while (k <= N)
            {
                mCoefficients[k] = mCoefficients[N - k];
                k++;
            }
        }